

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unlockBtreeIfUnused(BtShared *pBt)

{
  MemPage *pPage;
  MemPage *pPage1;
  BtShared *pBt_local;
  
  if ((pBt->inTransaction == '\0') && (pBt->pPage1 != (MemPage *)0x0)) {
    pPage = pBt->pPage1;
    pBt->pPage1 = (MemPage *)0x0;
    releasePageNotNull(pPage);
  }
  return;
}

Assistant:

static void unlockBtreeIfUnused(BtShared *pBt){
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( countValidCursors(pBt,0)==0 || pBt->inTransaction>TRANS_NONE );
  if( pBt->inTransaction==TRANS_NONE && pBt->pPage1!=0 ){
    MemPage *pPage1 = pBt->pPage1;
    assert( pPage1->aData );
    assert( sqlite3PagerRefcount(pBt->pPager)==1 );
    pBt->pPage1 = 0;
    releasePageNotNull(pPage1);
  }
}